

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O3

float ImGuizmo::ComputeAngleOnPlan(void)

{
  vec_t *in_RDX;
  vec_t *in_RSI;
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Db;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar2 = IntersectRayPlane((vec_t *)&DAT_001fc28c,in_RSI,in_RDX);
  fVar5 = (DAT_001fc24c * fVar2 + DAT_001fc23c) - DAT_001fc09c;
  fVar6 = (DAT_001fc250 * fVar2 + DAT_001fc240) - DAT_001fc0a0;
  fVar3 = (fVar2 * DAT_001fc254 + DAT_001fc244) - DAT_001fc0a4;
  fVar9 = _DAT_001fc2c0 * _DAT_001fc294 - _DAT_001fc290 * _DAT_001fc2c4;
  fVar12 = _DAT_001fc2c4 * _DAT_001fc28c - _DAT_001fc294 * _DAT_001fc2bc;
  fVar7 = _DAT_001fc290 * _DAT_001fc2bc - _DAT_001fc28c * _DAT_001fc2c0;
  auVar8._0_4_ = fVar3 * fVar3 + fVar5 * fVar5 + fVar6 * fVar6;
  auVar8._4_4_ = fVar7 * fVar7 + fVar9 * fVar9 + fVar12 * fVar12;
  auVar8._8_4_ = extraout_XMM0_Db * extraout_XMM0_Db + 0.0;
  auVar8._12_4_ = 0;
  auVar8 = sqrtps(auVar8,auVar8);
  auVar8 = divps(_DAT_001a0020,auVar8);
  fVar10 = auVar8._0_4_;
  fVar11 = auVar8._4_4_;
  fVar4 = _DAT_001fc2c4 * fVar3 * fVar10 +
          _DAT_001fc2bc * fVar5 * fVar10 + _DAT_001fc2c0 * fVar6 * fVar10;
  fVar2 = 0.9999;
  if (fVar4 <= 0.9999) {
    fVar2 = fVar4;
  }
  fVar2 = acosf((float)(-(uint)(fVar4 < -0.9999) & 0xbf7ff972 |
                       ~-(uint)(fVar4 < -0.9999) & (uint)fVar2));
  uVar1 = -(uint)(fVar11 * fVar7 * fVar3 * fVar10 +
                  fVar9 * fVar11 * fVar5 * fVar10 + fVar12 * fVar11 * fVar6 * fVar10 < 0.0);
  return (float)((uint)fVar2 & uVar1 | ~uVar1 & (uint)-fVar2);
}

Assistant:

static float ComputeAngleOnPlan()
   {
      const float len = IntersectRayPlane(gContext.mRayOrigin, gContext.mRayVector, gContext.mTranslationPlan);
      vec_t localPos = Normalized(gContext.mRayOrigin + gContext.mRayVector * len - gContext.mModel.v.position);

      vec_t perpendicularVector;
      perpendicularVector.Cross(gContext.mRotationVectorSource, gContext.mTranslationPlan);
      perpendicularVector.Normalize();
      float acosAngle = Clamp(Dot(localPos, gContext.mRotationVectorSource), -0.9999f, 0.9999f);
      float angle = acosf(acosAngle);
      angle *= (Dot(localPos, perpendicularVector) < 0.f) ? 1.f : -1.f;
      return angle;
   }